

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::ValidateOptions
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FileDescriptor *pFVar1;
  string_view element_name;
  int local_4c;
  FileDescriptor *local_48;
  VoidPtr local_40;
  code *pcStack_38;
  FileDescriptor **local_30;
  int *local_28;
  
  local_48 = file;
  ValidateFileFeatures(this,file,proto);
  if ((((local_48 == (FileDescriptor *)0x0) ||
       (local_48->options_ == (FileOptions *)_FileOptions_default_instance_)) ||
      ((local_48->options_->field_0)._impl_.optimize_for_ != 3)) &&
     (local_4c = 0, 0 < local_48->dependency_count_)) {
    do {
      pFVar1 = FileDescriptor::dependency(local_48,local_4c);
      if (((pFVar1 != (FileDescriptor *)0x0) &&
          (pFVar1->options_ != (FileOptions *)_FileOptions_default_instance_)) &&
         ((pFVar1->options_->field_0)._impl_.optimize_for_ == 3)) {
        pFVar1 = FileDescriptor::dependency(local_48,local_4c);
        local_40.obj = &local_30;
        pcStack_38 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptorProto_const&)::__0,std::__cxx11::string>
        ;
        make_error.invoker_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptorProto_const&)::__0,std::__cxx11::string>
        ;
        make_error.ptr_.obj = local_40.obj;
        element_name._M_str = (pFVar1->name_->_M_dataplus)._M_p;
        element_name._M_len = pFVar1->name_->_M_string_length;
        local_30 = &local_48;
        local_28 = &local_4c;
        AddError(this,element_name,&proto->super_Message,IMPORT,make_error);
        break;
      }
      local_4c = local_4c + 1;
    } while (local_4c < local_48->dependency_count_);
  }
  if (local_48->edition_ == EDITION_PROTO3) {
    ValidateProto3(this,local_48,proto);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateOptions(const FileDescriptor* file,
                                        const FileDescriptorProto& proto) {
  ValidateFileFeatures(file, proto);

  // Lite files can only be imported by other Lite files.
  if (!IsLite(file)) {
    for (int i = 0; i < file->dependency_count(); i++) {
      if (IsLite(file->dependency(i))) {
        AddError(file->dependency(i)->name(), proto,
                 DescriptorPool::ErrorCollector::IMPORT, [&] {
                   return absl::StrCat(
                       "Files that do not use optimize_for = LITE_RUNTIME "
                       "cannot import files which do use this option.  This "
                       "file is not lite, but it imports \"",
                       file->dependency(i)->name(), "\" which is.");
                 });
        break;
      }
    }
  }
  if (file->edition() == Edition::EDITION_PROTO3) {
    ValidateProto3(file, proto);
  }
}